

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCPUThreadCount
          (BeagleCPUImpl<double,_1,_0> *this,int threadCount)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  void *pvVar6;
  int *piVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM5 [64];
  
  if (threadCount < 1) {
    iVar10 = -5;
  }
  else {
    this->kThreadingEnabled = false;
    this->kAutoPartitioningEnabled = false;
    iVar10 = 0;
    if ((this->kFlags & 0x40000000) != 0) {
      iVar4 = std::thread::hardware_concurrency();
      uVar1 = this->kPatternCount;
      uVar5 = 2;
      if (this->kStateCount < 5) {
        uVar5 = (uint)(iVar4 < 0x10) << 9 | 0x100;
      }
      this->kMinPatternCount = uVar5;
      if ((2 < iVar4) && ((int)uVar5 <= (int)uVar1)) {
        uVar12 = 0;
        uVar9 = (ulong)uVar1 / (ulong)(uVar5 >> 1);
        uVar5 = (uint)uVar9;
        uVar11 = (ulong)(uint)threadCount;
        if (uVar5 < (uint)threadCount) {
          uVar11 = uVar9;
        }
        pvVar6 = malloc((ulong)uVar1 * 4);
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar15 = vpbroadcastq_avx512f(ZEXT816(0x10));
        auVar16 = vpbroadcastd_avx512f();
        auVar17 = vpbroadcastq_avx512f();
        auVar18 = vpbroadcastd_avx512f();
        do {
          uVar9 = vpcmpuq_avx512f(auVar14,auVar17,2);
          iVar10 = (int)(uVar1 / uVar11);
          iVar4 = (int)uVar12;
          if ((uVar9 & 1) != 0) {
            in_ZMM5 = ZEXT464((uint)((long)((ulong)(uint)(iVar4 >> 0x1f) << 0x20 |
                                           uVar12 & 0xffffffff) / (long)iVar10));
          }
          if ((uVar9 & 2) != 0) {
            auVar3 = vpinsrd_avx(in_ZMM5._0_16_,(iVar4 + 1) / iVar10,1);
            in_ZMM5 = vinserti32x4_avx512f(in_ZMM5,auVar3,0);
          }
          if ((uVar9 & 4) != 0) {
            auVar3 = vpinsrd_avx(in_ZMM5._0_16_,(iVar4 + 2) / iVar10,2);
            in_ZMM5 = vinserti32x4_avx512f(in_ZMM5,auVar3,0);
          }
          if ((uVar9 & 8) != 0) {
            auVar3 = vpinsrd_avx(in_ZMM5._0_16_,(iVar4 + 3) / iVar10,3);
            in_ZMM5 = vinserti32x4_avx512f(in_ZMM5,auVar3,0);
          }
          auVar21 = in_ZMM5;
          if ((uVar9 & 0x10) != 0) {
            auVar19 = vpbroadcastd_avx512f();
            auVar21._0_16_ = in_ZMM5._0_16_;
            auVar21._16_4_ = auVar19._16_4_;
            auVar21._20_4_ = in_ZMM5._20_4_;
            auVar21._24_4_ = in_ZMM5._24_4_;
            auVar21._28_4_ = in_ZMM5._28_4_;
            auVar21._32_4_ = in_ZMM5._32_4_;
            auVar21._36_4_ = in_ZMM5._36_4_;
            auVar21._40_4_ = in_ZMM5._40_4_;
            auVar21._44_4_ = in_ZMM5._44_4_;
            auVar21._48_4_ = in_ZMM5._48_4_;
            auVar21._52_4_ = in_ZMM5._52_4_;
            auVar21._56_4_ = in_ZMM5._56_4_;
            auVar21._60_4_ = in_ZMM5._60_4_;
          }
          auVar19 = auVar21;
          if ((uVar9 & 0x20) != 0) {
            auVar20 = vpbroadcastd_avx512f();
            auVar19._0_20_ = auVar21._0_20_;
            auVar19._20_4_ = auVar20._20_4_;
            auVar19._24_4_ = auVar21._24_4_;
            auVar19._28_4_ = auVar21._28_4_;
            auVar19._32_4_ = auVar21._32_4_;
            auVar19._36_4_ = auVar21._36_4_;
            auVar19._40_4_ = auVar21._40_4_;
            auVar19._44_4_ = auVar21._44_4_;
            auVar19._48_4_ = auVar21._48_4_;
            auVar19._52_4_ = auVar21._52_4_;
            auVar19._56_4_ = auVar21._56_4_;
            auVar19._60_4_ = auVar21._60_4_;
          }
          auVar20 = auVar19;
          if ((uVar9 & 0x40) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar20._0_24_ = auVar19._0_24_;
            auVar20._24_4_ = auVar21._24_4_;
            auVar20._28_4_ = auVar19._28_4_;
            auVar20._32_4_ = auVar19._32_4_;
            auVar20._36_4_ = auVar19._36_4_;
            auVar20._40_4_ = auVar19._40_4_;
            auVar20._44_4_ = auVar19._44_4_;
            auVar20._48_4_ = auVar19._48_4_;
            auVar20._52_4_ = auVar19._52_4_;
            auVar20._56_4_ = auVar19._56_4_;
            auVar20._60_4_ = auVar19._60_4_;
          }
          auVar22 = auVar20;
          if ((uVar9 & 0x80) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar22._0_28_ = auVar20._0_28_;
            auVar22._28_4_ = auVar21._28_4_;
            auVar22._32_4_ = auVar20._32_4_;
            auVar22._36_4_ = auVar20._36_4_;
            auVar22._40_4_ = auVar20._40_4_;
            auVar22._44_4_ = auVar20._44_4_;
            auVar22._48_4_ = auVar20._48_4_;
            auVar22._52_4_ = auVar20._52_4_;
            auVar22._56_4_ = auVar20._56_4_;
            auVar22._60_4_ = auVar20._60_4_;
          }
          uVar9 = vpcmpuq_avx512f(auVar13,auVar17,2);
          auVar23 = auVar22;
          if ((uVar9 & 1) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar23._0_32_ = auVar22._0_32_;
            auVar23._32_4_ = auVar21._32_4_;
            auVar23._36_4_ = auVar22._36_4_;
            auVar23._40_4_ = auVar22._40_4_;
            auVar23._44_4_ = auVar22._44_4_;
            auVar23._48_4_ = auVar22._48_4_;
            auVar23._52_4_ = auVar22._52_4_;
            auVar23._56_4_ = auVar22._56_4_;
            auVar23._60_4_ = auVar22._60_4_;
          }
          auVar24 = auVar23;
          if ((uVar9 & 2) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar24._0_36_ = auVar23._0_36_;
            auVar24._36_4_ = auVar21._36_4_;
            auVar24._40_4_ = auVar23._40_4_;
            auVar24._44_4_ = auVar23._44_4_;
            auVar24._48_4_ = auVar23._48_4_;
            auVar24._52_4_ = auVar23._52_4_;
            auVar24._56_4_ = auVar23._56_4_;
            auVar24._60_4_ = auVar23._60_4_;
          }
          auVar25 = auVar24;
          if ((uVar9 & 4) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar25._0_40_ = auVar24._0_40_;
            auVar25._40_4_ = auVar21._40_4_;
            auVar25._44_4_ = auVar24._44_4_;
            auVar25._48_4_ = auVar24._48_4_;
            auVar25._52_4_ = auVar24._52_4_;
            auVar25._56_4_ = auVar24._56_4_;
            auVar25._60_4_ = auVar24._60_4_;
          }
          auVar26 = auVar25;
          if ((uVar9 & 8) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar26._0_44_ = auVar25._0_44_;
            auVar26._44_4_ = auVar21._44_4_;
            auVar26._48_4_ = auVar25._48_4_;
            auVar26._52_4_ = auVar25._52_4_;
            auVar26._56_4_ = auVar25._56_4_;
            auVar26._60_4_ = auVar25._60_4_;
          }
          auVar27 = auVar26;
          if ((uVar9 & 0x10) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar27._0_48_ = auVar26._0_48_;
            auVar27._48_4_ = auVar21._48_4_;
            auVar27._52_4_ = auVar26._52_4_;
            auVar27._56_4_ = auVar26._56_4_;
            auVar27._60_4_ = auVar26._60_4_;
          }
          auVar28 = auVar27;
          if ((uVar9 & 0x20) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar28._0_52_ = auVar27._0_52_;
            auVar28._52_4_ = auVar21._52_4_;
            auVar28._56_4_ = auVar27._56_4_;
            auVar28._60_4_ = auVar27._60_4_;
          }
          auVar29 = auVar28;
          if ((uVar9 & 0x40) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar29._0_56_ = auVar28._0_56_;
            auVar29._56_4_ = auVar21._56_4_;
            auVar29._60_4_ = auVar28._60_4_;
          }
          auVar30 = auVar29;
          if ((uVar9 & 0x80) != 0) {
            auVar21 = vpbroadcastd_avx512f();
            auVar30._60_4_ = auVar21._60_4_;
            auVar30._0_60_ = auVar29._0_60_;
          }
          uVar9 = vpcmpgtd_avx512f(auVar16,auVar30);
          auVar14 = vpaddq_avx512f(auVar14,auVar15);
          auVar13 = vpaddq_avx512f(auVar13,auVar15);
          auVar21 = vpblendmd_avx512f(auVar18,auVar30);
          bVar2 = (bool)((byte)uVar9 & 1);
          in_ZMM5._0_4_ = (uint)bVar2 * auVar21._0_4_ | (uint)!bVar2 * auVar30._0_4_;
          bVar2 = (bool)((byte)(uVar9 >> 1) & 1);
          in_ZMM5._4_4_ = (uint)bVar2 * auVar21._4_4_ | (uint)!bVar2 * auVar30._4_4_;
          bVar2 = (bool)((byte)(uVar9 >> 2) & 1);
          in_ZMM5._8_4_ = (uint)bVar2 * auVar21._8_4_ | (uint)!bVar2 * auVar30._8_4_;
          bVar2 = (bool)((byte)(uVar9 >> 3) & 1);
          in_ZMM5._12_4_ = (uint)bVar2 * auVar21._12_4_ | (uint)!bVar2 * auVar30._12_4_;
          bVar2 = (bool)((byte)(uVar9 >> 4) & 1);
          in_ZMM5._16_4_ = (uint)bVar2 * auVar21._16_4_ | (uint)!bVar2 * auVar30._16_4_;
          bVar2 = (bool)((byte)(uVar9 >> 5) & 1);
          in_ZMM5._20_4_ = (uint)bVar2 * auVar21._20_4_ | (uint)!bVar2 * auVar30._20_4_;
          bVar2 = (bool)((byte)(uVar9 >> 6) & 1);
          in_ZMM5._24_4_ = (uint)bVar2 * auVar21._24_4_ | (uint)!bVar2 * auVar30._24_4_;
          bVar2 = (bool)((byte)(uVar9 >> 7) & 1);
          in_ZMM5._28_4_ = (uint)bVar2 * auVar21._28_4_ | (uint)!bVar2 * auVar30._28_4_;
          bVar2 = (bool)((byte)(uVar9 >> 8) & 1);
          in_ZMM5._32_4_ = (uint)bVar2 * auVar21._32_4_ | (uint)!bVar2 * auVar30._32_4_;
          bVar2 = (bool)((byte)(uVar9 >> 9) & 1);
          in_ZMM5._36_4_ = (uint)bVar2 * auVar21._36_4_ | (uint)!bVar2 * auVar30._36_4_;
          bVar2 = (bool)((byte)(uVar9 >> 10) & 1);
          in_ZMM5._40_4_ = (uint)bVar2 * auVar21._40_4_ | (uint)!bVar2 * auVar30._40_4_;
          bVar2 = (bool)((byte)(uVar9 >> 0xb) & 1);
          in_ZMM5._44_4_ = (uint)bVar2 * auVar21._44_4_ | (uint)!bVar2 * auVar30._44_4_;
          bVar2 = (bool)((byte)(uVar9 >> 0xc) & 1);
          in_ZMM5._48_4_ = (uint)bVar2 * auVar21._48_4_ | (uint)!bVar2 * auVar30._48_4_;
          bVar2 = (bool)((byte)(uVar9 >> 0xd) & 1);
          in_ZMM5._52_4_ = (uint)bVar2 * auVar21._52_4_ | (uint)!bVar2 * auVar30._52_4_;
          bVar2 = (bool)((byte)(uVar9 >> 0xe) & 1);
          in_ZMM5._56_4_ = (uint)bVar2 * auVar21._56_4_ | (uint)!bVar2 * auVar30._56_4_;
          bVar2 = SUB81(uVar9 >> 0xf,0);
          in_ZMM5._60_4_ = (uint)bVar2 * auVar21._60_4_ | (uint)!bVar2 * auVar30._60_4_;
          auVar21 = vmovdqu32_avx512f(in_ZMM5);
          *(undefined1 (*) [64])((long)pvVar6 + uVar12 * 4) = auVar21;
          uVar12 = uVar12 + 0x10;
        } while ((uVar1 + 0xf & 0xfffffff0) != uVar12);
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar11,pvVar6);
        piVar7 = (int *)malloc((long)this->kPartitionCount *
                               (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24);
        this->gAutoPartitionOperations = piVar7;
        if (this->kMinPatternCount * 4 <= this->kPatternCount) {
          piVar7 = (int *)malloc(uVar11 * 4);
          auVar13 = vpbroadcastq_avx512f(ZEXT816(0x10));
          this->gAutoPartitionIndices = piVar7;
          if (0 < (int)uVar5) {
            auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar16 = vpmovsxbd_avx512f(_DAT_00141b90);
            auVar17 = vpbroadcastd_avx512f(ZEXT416(0x10));
            iVar10 = 1;
            if (1 < (int)uVar11) {
              iVar10 = (int)uVar11;
            }
            auVar18 = vpbroadcastq_avx512f();
            uVar9 = 0;
            do {
              vpcmpuq_avx512f(auVar15,auVar18,2);
              vpcmpuq_avx512f(auVar14,auVar18,2);
              auVar15 = vpaddq_avx512f(auVar15,auVar13);
              auVar14 = vpaddq_avx512f(auVar14,auVar13);
              auVar21 = vmovdqu32_avx512f(auVar16);
              *(undefined1 (*) [64])(piVar7 + uVar9) = auVar21;
              uVar9 = uVar9 + 0x10;
              auVar16 = vpaddd_avx512f(auVar16,auVar17);
            } while ((iVar10 + 0xfU & 0xfffffff0) != uVar9);
          }
          pdVar8 = (double *)malloc(uVar11 << 3);
          this->gAutoPartitionOutSumLogLikelihoods = pdVar8;
          this->kAutoRootPartitioningEnabled = true;
        }
        iVar10 = 0;
        this->kAutoPartitioningEnabled = true;
      }
    }
  }
  return iVar10;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCPUThreadCount(int threadCount) {

    if (threadCount < 1)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > threadCount) {
                partitionCount = threadCount;
            }

            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = true;
            }

            kAutoPartitioningEnabled = true;
        }
    }

    return BEAGLE_SUCCESS;
}